

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,Mode value)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Mode::Undefined";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Mode::Write";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Mode::Read";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Mode::Append";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "ToString: Unknown Mode";
    paVar1 = &local_f;
    break;
  case 5:
    pcVar2 = "Mode::Sync";
    paVar1 = &local_d;
    break;
  case 6:
    pcVar2 = "Mode::Deferred";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(Mode value)
{
    switch (value)
    {
    case Mode::Undefined:
        return "Mode::Undefined";
    case Mode::Write:
        return "Mode::Write";
    case Mode::Read:
        return "Mode::Read";
    case Mode::Append:
        return "Mode::Append";
    case Mode::Sync:
        return "Mode::Sync";
    case Mode::Deferred:
        return "Mode::Deferred";
    default:
        return "ToString: Unknown Mode";
    }
}